

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::ExtensionMethodName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *descriptor)

{
  string result;
  string name;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  (anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
            (&local_30,(_anonymous_namespace_ *)this,descriptor);
  anon_unknown_0::UnderscoresToCamelCase(&local_50,&local_30,false);
  std::__cxx11::string::string((string *)&local_70,"",&local_91);
  std::__cxx11::string::string((string *)&local_90,"_Extension",&local_92);
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,&local_70,&local_50,&local_90,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string ExtensionMethodName(const FieldDescriptor* descriptor) {
  const string name = NameFromFieldDescriptor(descriptor);
  const string result = UnderscoresToCamelCase(name, false);
  return SanitizeNameForObjC("", result, "_Extension", NULL);
}